

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raster.cpp
# Opt level: O1

Raster * rw::Raster::createFromImage(Image *image,int32 platform)

{
  int iVar1;
  Raster *pRVar2;
  int32 format;
  int32 depth;
  int32 height;
  int32 width;
  int32 local_38;
  int32 local_34;
  int32 local_30;
  int32 local_2c;
  
  iVar1 = platform;
  if (platform == 0) {
    iVar1 = rw::platform;
  }
  iVar1 = (**(code **)(*(long *)(engine + 0x20 + (long)iVar1 * 8) + 0x40))
                    (image,4,&local_2c,&local_30,&local_34,&local_38);
  if ((iVar1 == 0) ||
     (pRVar2 = create(local_2c,local_30,local_34,local_38,platform), pRVar2 == (Raster *)0x0)) {
    pRVar2 = (Raster *)0x0;
  }
  else {
    if (platform == 0) {
      platform = rw::platform;
    }
    iVar1 = (**(code **)(*(long *)(engine + 0x20 + (long)platform * 8) + 0x48))(pRVar2,image);
    if (iVar1 == 0) {
      pRVar2 = (Raster *)0x0;
    }
  }
  return pRVar2;
}

Assistant:

Raster*
Raster::createFromImage(Image *image, int32 platform)
{
	Raster *raster;
	int32 width, height, depth, format;
	if(!imageFindRasterFormat(image, TEXTURE, &width, &height, &depth, &format, platform))
		return nil;
	raster = Raster::create(width, height, depth, format, platform);
	if(raster == nil)
		return nil;
	return raster->setFromImage(image, platform);
}